

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall SGParser::Generator::NFA::AddLink(NFA *this,NFANode *modify,uint c,NFANode *target)

{
  NFANode *local_28;
  NFANode *target_local;
  NFANode *pNStack_18;
  uint c_local;
  NFANode *modify_local;
  NFA *this_local;
  
  local_28 = target;
  target_local._4_4_ = c;
  pNStack_18 = modify;
  modify_local = (NFANode *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&modify->LinkChar,(value_type_conflict2 *)((long)&target_local + 4));
  std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
  push_back(&pNStack_18->LinkPtr,&local_28);
  return;
}

Assistant:

void    NFA::AddLink(NFANode* modify, unsigned c, NFANode* target) {
    modify->LinkChar.push_back(c);
    modify->LinkPtr.push_back(target);
}